

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O3

duckdb_varint * duckdb_get_varint(duckdb_varint *__return_storage_ptr__,duckdb_value val)

{
  char (*__src) [4];
  pointer __src_00;
  string *psVar1;
  uint8_t *__dest;
  size_t __size;
  bool is_negative;
  vector<unsigned_char,_true> byte_array;
  Value v;
  bool local_89;
  pointer local_88;
  element_type *peStack_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  anon_union_16_2_67f50693_for_value local_70;
  Value local_60;
  
  duckdb::LogicalType::LogicalType((LogicalType *)&local_88,VARINT);
  duckdb::Value::DefaultCastAs(&local_60,(Value *)val,(LogicalType *)&local_88,false);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_88);
  psVar1 = duckdb::StringValue::Get_abi_cxx11_(&local_60);
  local_88 = (pointer)0x0;
  peStack_80 = (element_type *)0x0;
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __src = (char (*) [4])(psVar1->_M_dataplus)._M_p;
  local_70.pointer.length = (uint32_t)psVar1->_M_string_length;
  if (local_70.pointer.length < 0xd) {
    local_70._12_4_ = 0;
    local_70.pointer.prefix[0] = '\0';
    local_70.pointer.prefix[1] = '\0';
    local_70.pointer.prefix[2] = '\0';
    local_70.pointer.prefix[3] = '\0';
    local_70._8_4_ = 0;
    if (local_70.pointer.length != 0) {
      switchD_00b03519::default
                (local_70.pointer.prefix,__src,(ulong)(local_70.pointer.length & 0xf));
    }
  }
  else {
    local_70.pointer.prefix = *__src;
    local_70._8_4_ = SUB84(__src,0);
    local_70._12_4_ = (undefined4)((ulong)__src >> 0x20);
  }
  duckdb::Varint::GetByteArray
            ((vector<unsigned_char,_true> *)&local_88,&local_89,(string_t *)&local_70.pointer);
  __src_00 = local_88;
  __size = (long)peStack_80 - (long)local_88;
  __dest = (uint8_t *)malloc(__size);
  switchD_00b03519::default(__dest,__src_00,__size);
  __return_storage_ptr__->data = __dest;
  __return_storage_ptr__->size = __size;
  __return_storage_ptr__->is_negative = local_89;
  if (__src_00 != (pointer)0x0) {
    operator_delete(__src_00);
  }
  duckdb::Value::~Value(&local_60);
  return __return_storage_ptr__;
}

Assistant:

duckdb_varint duckdb_get_varint(duckdb_value val) {
	auto v = UnwrapValue(val).DefaultCastAs(duckdb::LogicalType::VARINT);
	auto &str = duckdb::StringValue::Get(v);
	duckdb::vector<uint8_t> byte_array;
	bool is_negative;
	duckdb::Varint::GetByteArray(byte_array, is_negative, duckdb::string_t(str));
	auto size = byte_array.size();
	auto data = reinterpret_cast<uint8_t *>(malloc(size));
	memcpy(data, byte_array.data(), size);
	return {data, size, is_negative};
}